

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

PgHdr1 * pcache1FetchStage2(PCache1 *pCache,uint iKey,int createFlag)

{
  PGroup *pPVar1;
  uint uVar2;
  int iVar3;
  int in_EDX;
  uint in_ESI;
  PCache1 *in_RDI;
  uint h;
  PCache1 *pOther;
  PgHdr1 *pPage;
  PGroup *pGroup;
  uint nPinned;
  PCache1 *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  PCache1 *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  PgHdr1 *local_8;
  
  pPVar1 = in_RDI->pGroup;
  local_8 = (PgHdr1 *)0x0;
  uVar2 = in_RDI->nPage - in_RDI->nRecyclable;
  if ((in_EDX == 1) &&
     (((pPVar1->mxPinned <= uVar2 || (in_RDI->n90pct <= uVar2)) ||
      ((iVar3 = pcache1UnderMemoryPressure(in_stack_ffffffffffffffb8), iVar3 != 0 &&
       (in_RDI->nRecyclable < uVar2)))))) {
    local_8 = (PgHdr1 *)0x0;
  }
  else {
    if (in_RDI->nHash <= in_RDI->nPage) {
      pcache1ResizeHash((PCache1 *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    }
    if (((in_RDI->bPurgeable != 0) && (((pPVar1->lru).pLruPrev)->isAnchor == 0)) &&
       ((in_RDI->nMax <= in_RDI->nPage + 1 ||
        (iVar3 = pcache1UnderMemoryPressure(in_stack_ffffffffffffffb8), iVar3 != 0)))) {
      local_8 = (pPVar1->lru).pLruPrev;
      pcache1RemoveFromHash(local_8,-0x55555556);
      pcache1PinPage(local_8);
      in_stack_ffffffffffffffc8 = local_8->pCache;
      if (in_stack_ffffffffffffffc8->szAlloc == in_RDI->szAlloc) {
        pPVar1->nPurgeable =
             pPVar1->nPurgeable - (in_stack_ffffffffffffffc8->bPurgeable - in_RDI->bPurgeable);
      }
      else {
        pcache1FreePage((PgHdr1 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        local_8 = (PgHdr1 *)0x0;
      }
    }
    if (local_8 == (PgHdr1 *)0x0) {
      local_8 = pcache1AllocPage(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    }
    if (local_8 != (PgHdr1 *)0x0) {
      uVar2 = in_ESI % in_RDI->nHash;
      in_RDI->nPage = in_RDI->nPage + 1;
      local_8->iKey = in_ESI;
      local_8->pNext = in_RDI->apHash[uVar2];
      local_8->pCache = in_RDI;
      local_8->pLruNext = (PgHdr1 *)0x0;
      *(undefined8 *)(local_8->page).pExtra = 0;
      in_RDI->apHash[uVar2] = local_8;
      if (in_RDI->iMaxKey < in_ESI) {
        in_RDI->iMaxKey = in_ESI;
      }
    }
  }
  return local_8;
}

Assistant:

static SQLITE_NOINLINE PgHdr1 *pcache1FetchStage2(
  PCache1 *pCache,
  unsigned int iKey,
  int createFlag
){
  unsigned int nPinned;
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *pPage = 0;

  /* Step 3: Abort if createFlag is 1 but the cache is nearly full */
  assert( pCache->nPage >= pCache->nRecyclable );
  nPinned = pCache->nPage - pCache->nRecyclable;
  assert( pGroup->mxPinned == pGroup->nMaxPage + 10 - pGroup->nMinPage );
  assert( pCache->n90pct == pCache->nMax*9/10 );
  if( createFlag==1 && (
        nPinned>=pGroup->mxPinned
     || nPinned>=pCache->n90pct
     || (pcache1UnderMemoryPressure(pCache) && pCache->nRecyclable<nPinned)
  )){
    return 0;
  }

  if( pCache->nPage>=pCache->nHash ) pcache1ResizeHash(pCache);
  assert( pCache->nHash>0 && pCache->apHash );

  /* Step 4. Try to recycle a page. */
  if( pCache->bPurgeable
   && !pGroup->lru.pLruPrev->isAnchor
   && ((pCache->nPage+1>=pCache->nMax) || pcache1UnderMemoryPressure(pCache))
  ){
    PCache1 *pOther;
    pPage = pGroup->lru.pLruPrev;
    assert( PAGE_IS_UNPINNED(pPage) );
    pcache1RemoveFromHash(pPage, 0);
    pcache1PinPage(pPage);
    pOther = pPage->pCache;
    if( pOther->szAlloc != pCache->szAlloc ){
      pcache1FreePage(pPage);
      pPage = 0;
    }else{
      pGroup->nPurgeable -= (pOther->bPurgeable - pCache->bPurgeable);
    }
  }

  /* Step 5. If a usable page buffer has still not been found,
  ** attempt to allocate a new one.
  */
  if( !pPage ){
    pPage = pcache1AllocPage(pCache, createFlag==1);
  }

  if( pPage ){
    unsigned int h = iKey % pCache->nHash;
    pCache->nPage++;
    pPage->iKey = iKey;
    pPage->pNext = pCache->apHash[h];
    pPage->pCache = pCache;
    pPage->pLruNext = 0;
    /* pPage->pLruPrev = 0;
    ** No need to clear pLruPrev since it is not accessed when pLruNext==0 */
    *(void **)pPage->page.pExtra = 0;
    pCache->apHash[h] = pPage;
    if( iKey>pCache->iMaxKey ){
      pCache->iMaxKey = iKey;
    }
  }
  return pPage;
}